

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

void anm_extract(anm_entry_t *entry,char *filename,uint version)

{
  ushort uVar1;
  thtx_header_t *ptVar2;
  anm_entry_t *paVar3;
  int iVar4;
  uchar *__s;
  uchar *__ptr;
  FILE *__s_00;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  image_t image;
  image_t image_1;
  
  image.width = 0;
  image.height = 0;
  image.format = 0xffffffff;
  util_total_entry_size(entry,&image.width,&image.height);
  uVar6 = image.width;
  uVar8 = image.height;
  if (image.height == 0 || image.width == 0) {
    return;
  }
  util_makepath(filename);
  if (option_dont_add_offset_border == 0) {
    bVar11 = entry->header->y != 0 || entry->header->x != 0;
  }
  else {
    bVar11 = false;
  }
  if (version != 0x13) {
LAB_0010ce27:
    iVar4 = uVar6 * 4;
    __s = (uchar *)malloc((ulong)(uVar8 * iVar4));
    image.data = __s;
    memset(__s,0xff,(ulong)(uVar8 * iVar4));
    for (; entry != (anm_entry_t *)0x0; entry = entry->next_by_name) {
      for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
        ptVar2 = entry->thtx;
        if ((&DAT_00135400)[lVar7] == (uint)ptVar2->format) {
          if (option_dont_add_offset_border == 0) {
            uVar6 = entry->header->y;
            uVar10 = (ulong)(entry->header->x << 2);
          }
          else {
            uVar10 = 0;
            uVar6 = 0;
          }
          if (version == 0x13) {
            png_read_mem(&image_1,entry->data,(ulong)ptVar2->size);
            __ptr = image_1.data;
          }
          else {
            __ptr = format_to_rgba(entry->data,(uint)ptVar2->h * (uint)ptVar2->w,
                                   (&DAT_00135400)[lVar7]);
          }
          uVar9 = iVar4 * uVar6;
          iVar5 = 0;
          for (uVar8 = uVar6; uVar8 < entry->thtx->h + uVar6; uVar8 = uVar8 + 1) {
            uVar1 = entry->thtx->w;
            memcpy(__s + uVar9 + uVar10,__ptr + iVar5 * (uint)uVar1,(ulong)uVar1 << 2);
            uVar9 = uVar9 + iVar4;
            iVar5 = iVar5 + 4;
          }
          free(__ptr);
          entry->processed = 1;
        }
      }
    }
    png_write(filename,&image);
    free(image.data);
    return;
  }
  iVar4 = png_identify((uint8_t *)(entry->thtx + 1),entry->thtx->size);
  if ((iVar4 != 0) && ((bVar11 || (entry->next_by_name != (anm_entry_t *)0x0)))) {
    if (1 < option_verbose) {
      fprintf(_stderr,"%s: composing %s\n",argv0,filename);
    }
    goto LAB_0010ce27;
  }
  if (1 < option_verbose) {
    fprintf(_stderr,"%s: not composing %s\n",argv0,filename);
  }
  if (!bVar11) {
    paVar3 = entry->next_by_name;
    if (paVar3 == (anm_entry_t *)0x0) goto LAB_0010cff8;
    if (paVar3->next_by_name == (anm_entry_t *)0x0) {
      uVar6 = entry->thtx->size;
      if ((uVar6 == paVar3->thtx->size) &&
         (iVar4 = bcmp(entry->thtx + 1,paVar3->thtx + 1,(ulong)uVar6), iVar4 == 0))
      goto LAB_0010cff8;
    }
  }
  fprintf(_stderr,"%s: warning: %s can\'t be composed because it\'s a JPEG\n",argv0,filename);
LAB_0010cff8:
  __s_00 = fopen(filename,"wb");
  if (__s_00 == (FILE *)0x0) {
    return;
  }
  fwrite(entry->thtx + 1,1,(ulong)entry->thtx->size,__s_00);
  fclose(__s_00);
  return;
}

Assistant:

static void
anm_extract(
    anm_entry_t* entry,
    const char* filename,
    unsigned version)
{
    const format_t formats[] = {
        FORMAT_GRAY8,
        FORMAT_ARGB4444,
        FORMAT_RGB565,
        FORMAT_BGRA8888,
        FORMAT_RGBA8888
    };
    image_t image;

    unsigned int f, y;

    image.width = 0;
    image.height = 0;
    image.format = FORMAT_RGBA8888;

    util_total_entry_size(entry, &image.width, &image.height);

    if (image.width == 0 || image.height == 0) {
        /* Then there's nothing to extract. */
        return;
    }

    util_makepath(filename);

    uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
    uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;
    int is_png = 0;

    /* NEWHU: 19 */
    if (version == 19) {
        if (png_identify(entry->thtx->data, entry->thtx->size) &&
                (ox || oy || entry->next_by_name)) {
            if (option_verbose >= 2)
                fprintf(stderr, "%s: composing %s\n", argv0, filename);
            is_png = 1;
        } else {
            if (option_verbose >= 2)
                fprintf(stderr, "%s: not composing %s\n", argv0, filename);
            /* TH19's ability/dummy.png is used twice, but it's the same texture.
             * Avoid printing a warning in this particular case. */
            if (ox || oy || entry->next_by_name && (entry->next_by_name->next_by_name ||
                    entry->thtx->size != entry->next_by_name->thtx->size ||
                    memcmp(entry->thtx->data, entry->next_by_name->thtx->data, entry->thtx->size))) {
                fprintf(stderr, "%s: warning: %s can't be composed because it's a JPEG\n", argv0, filename);
            }
            FILE* stream = fopen(filename, "wb");
            if (stream) {
                fwrite(entry->thtx->data, 1, entry->thtx->size, stream);
                fclose(stream);
            }
            return;
        }
    }

    image.data = malloc(image.width * image.height * 4);
    /* XXX: Why 0xff? */
    memset(image.data, 0xff, image.width* image.height * 4);
    for (anm_entry_t *entryp = entry; entryp; entryp = entryp->next_by_name) {
        for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
            if (formats[f] == entryp->thtx->format) {
                ox = option_dont_add_offset_border ? 0 : entryp->header->x;
                oy = option_dont_add_offset_border ? 0 : entryp->header->y;
                unsigned char* temp_data = entry_to_rgba(entryp, is_png);
                for (y = oy; y < oy + entryp->thtx->h; ++y) {
                    memcpy(image.data + y * image.width * 4 + ox * 4,
                        temp_data + (y - oy) * entryp->thtx->w * 4,
                        entryp->thtx->w * 4);
                }
                free(temp_data);
                entryp->processed = 1;
            }
        }
    }

    png_write(filename, &image);
    free(image.data);
}